

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

Option * __thiscall
CLI::App::add_set<std::__cxx11::string>
          (App *this,string *name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *member,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *options,string *description)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  Option *pOVar3;
  long *plVar4;
  undefined8 uVar5;
  string *description_00;
  long *plVar6;
  string simple_name;
  callback_t fun;
  string typeval;
  long *local_1c8;
  long local_1b8;
  long lStack_1b0;
  undefined1 *local_1a8;
  long local_1a0;
  undefined1 local_198 [16];
  long *local_188;
  long local_180;
  long local_178;
  long lStack_170;
  _Any_data local_168;
  code *local_158;
  _Any_data local_148;
  code *local_138;
  undefined1 local_128 [8];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  _Alloc_hider local_f0;
  char local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  string local_70;
  string local_50;
  
  detail::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_128,name,',');
  if ((undefined1  [8])local_120._M_impl._0_8_ != local_128) {
    local_1a8 = local_198;
    pcVar2 = ((_Alloc_hider *)local_128)->_M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a8,pcVar2,pcVar2 + *(size_type *)((long)local_128 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_128);
    local_128 = (undefined1  [8])member;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree(&local_120,&options->_M_t);
    local_f0._M_p = local_e0;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_f0,local_1a8,local_1a8 + local_1a0)
    ;
    ::std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>::
    function<CLI::App::add_set<std::__cxx11::string>(std::__cxx11::string,std::__cxx11::string&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::__cxx11::string)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)_1_,void>
              ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>
                *)local_148._M_pod_data,(anon_class_88_3_1d669d6f *)local_128);
    if (local_f0._M_p != local_e0) {
      operator_delete(local_f0._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_120);
    pcVar2 = (name->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + name->_M_string_length);
    std::
    function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
    ::function((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
                *)&local_168,
               (function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
                *)&local_148);
    pcVar2 = (description->_M_dataplus)._M_p;
    local_90._0_8_ = (_Base_ptr)(local_90 + 0x10);
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(local_b0 + 0x20),pcVar2,pcVar2 + description->_M_string_length);
    description_00 = (string *)(local_b0 + 0x20);
    pOVar3 = add_option(this,&local_70,(callback_t *)&local_168,description_00,false);
    if ((_Base_ptr)local_90._0_8_ != (_Base_ptr)(local_90 + 0x10)) {
      operator_delete((void *)local_90._0_8_);
    }
    if (local_158 != (code *)0x0) {
      (*local_158)(&local_168,&local_168,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    p_Var1 = &local_120._M_impl.super__Rb_tree_header;
    local_128 = (undefined1  [8])p_Var1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"TEXT","");
    local_b0._0_8_ = local_b0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,",","");
    detail::
    join<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              (&local_50,(detail *)options,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_b0,description_00);
    plVar4 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1749a0);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_178 = *plVar6;
      lStack_170 = plVar4[3];
      local_188 = &local_178;
    }
    else {
      local_178 = *plVar6;
      local_188 = (long *)*plVar4;
    }
    local_180 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)::std::__cxx11::string::append((char *)&local_188);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_1b8 = *plVar6;
      lStack_1b0 = plVar4[3];
      local_1c8 = &local_1b8;
    }
    else {
      local_1b8 = *plVar6;
      local_1c8 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ::std::__cxx11::string::_M_append(local_128,(ulong)local_1c8);
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8);
    }
    if (local_188 != &local_178) {
      operator_delete(local_188);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_);
    }
    local_d0[0] = local_c0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,local_128,
               (undefined1 *)
               ((long)&((_Alloc_hider *)local_120._M_impl._0_8_)->_M_p +
               (long)&((_Rb_tree_node_base *)local_128)->_M_color));
    ::std::__cxx11::string::_M_assign((string *)&pOVar3->typeval_);
    pOVar3->expected_ = 1;
    pOVar3->changeable_ = false;
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0]);
    }
    if (local_128 != (undefined1  [8])p_Var1) {
      operator_delete((void *)local_128);
    }
    if (local_138 != (code *)0x0) {
      (*local_138)(&local_148,&local_148,__destroy_functor);
    }
    if (local_1a8 != local_198) {
      operator_delete(local_1a8);
    }
    return pOVar3;
  }
  uVar5 = ::std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
  __clang_call_terminate(uVar5);
}

Assistant:

Option *add_set(std::string name,
                    T &member,           ///< The selected member of the set
                    std::set<T> options, ///< The set of possibilities
                    std::string description = "") {

        std::string simple_name = CLI::detail::split(name, ',').at(0);
        CLI::callback_t fun = [&member, options, simple_name](CLI::results_t res) {
            bool retval = detail::lexical_cast(res[0], member);
            if(!retval)
                throw ConversionError(res[0], simple_name);
            return std::find(std::begin(options), std::end(options), member) != std::end(options);
        };

        Option *opt = add_option(name, fun, description, false);
        std::string typeval = detail::type_name<T>();
        typeval += " in {" + detail::join(options) + "}";
        opt->set_custom_option(typeval);
        return opt;
    }